

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O3

void curl_global_cleanup(void)

{
  if (initialized != 0) {
    initialized = initialized - 1;
    if (initialized == 0) {
      if (init_ssl == '\x01') {
        (*Curl_ssl->cleanup)();
        init_ssl = '\0';
      }
      return;
    }
  }
  return;
}

Assistant:

void curl_global_cleanup(void)
{
  global_init_lock();

  if(!initialized) {
    global_init_unlock();
    return;
  }

  if(--initialized) {
    global_init_unlock();
    return;
  }

  Curl_ssl_cleanup();
  Curl_resolver_global_cleanup();

#ifdef WIN32
  Curl_win32_cleanup(init_flags);
#endif

  Curl_amiga_cleanup();

  Curl_ssh_cleanup();

#ifdef USE_WOLFSSH
  (void)wolfSSH_Cleanup();
#endif
#ifdef DEBUGBUILD
  free(leakpointer);
#endif

  init_flags  = 0;

  global_init_unlock();
}